

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void __thiscall re2c::Cases::emit(Cases *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  OutputFile *pOVar1;
  bool *readCh_00;
  uint local_58;
  uint32_t i;
  string local_48;
  re2c *local_28;
  bool *readCh_local;
  OutputFile *pOStack_18;
  uint32_t ind_local;
  OutputFile *o_local;
  Cases *this_local;
  
  local_28 = (re2c *)readCh;
  readCh_local._4_4_ = ind;
  pOStack_18 = o;
  o_local = (OutputFile *)this;
  pOVar1 = OutputFile::wind(o,ind);
  pOVar1 = OutputFile::ws(pOVar1,"switch (");
  output_yych_abi_cxx11_(&local_48,local_28,readCh_00);
  pOVar1 = OutputFile::wstring(pOVar1,&local_48);
  OutputFile::ws(pOVar1,") {\n");
  std::__cxx11::string::~string((string *)&local_48);
  for (local_58 = 0; local_58 < this->cases_size; local_58 = local_58 + 1) {
    if (this->cases[local_58].to != this->def) {
      Case::emit(this->cases + local_58,pOStack_18,readCh_local._4_4_);
      output_goto(pOStack_18,1,(bool *)local_28,(label_t)((this->cases[local_58].to)->label).value);
    }
  }
  pOVar1 = OutputFile::wind(pOStack_18,readCh_local._4_4_);
  OutputFile::ws(pOVar1,"default:");
  output_goto(pOStack_18,1,(bool *)local_28,(label_t)(this->def->label).value);
  pOVar1 = OutputFile::wind(pOStack_18,readCh_local._4_4_);
  OutputFile::ws(pOVar1,"}\n");
  return;
}

Assistant:

void Cases::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	o.wind(ind).ws("switch (").wstring(output_yych (readCh)).ws(") {\n");
	for (uint32_t i = 0; i < cases_size; ++i)
	{
		if (cases[i].to != def)
		{
			cases[i].emit (o, ind);
			output_goto (o, 1, readCh, cases[i].to->label);
		}
	}
	o.wind(ind).ws("default:");
	output_goto (o, 1, readCh, def->label);
	o.wind(ind).ws("}\n");
}